

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O1

sftp_command * sftp_getcmd(FILE *fp,wchar_t mode,wchar_t modeflags)

{
  size_t sVar1;
  sftp_command *psVar2;
  byte *__s;
  size_t sVar3;
  byte *pbVar4;
  char **ppcVar5;
  char *pcVar6;
  sftp_cmd_lookup *psVar7;
  code *pcVar8;
  byte *pbVar9;
  bool bVar10;
  byte bVar11;
  byte *s;
  bool bVar12;
  
  psVar2 = (sftp_command *)safemalloc(1,0x20,0);
  psVar2->words = (char **)0x0;
  psVar2->nwords = 0;
  psVar2->wordssize = 0;
  if (fp == (FILE *)0x0) {
    __s = (byte *)ssh_sftp_get_cmdline("psftp> ",backend == (Backend *)0x0);
  }
  else {
    if ((modeflags & 1U) != 0) {
      printf("psftp> ");
    }
    __s = (byte *)fgetline(fp);
  }
  if ((__s == (byte *)0x0) || (*__s == 0)) {
    psVar2->obey = sftp_cmd_quit;
    if (mode == L'\0' || (modeflags & 1U) != 0) {
      puts("quit");
    }
    safefree(__s);
    return psVar2;
  }
  sVar3 = strcspn((char *)__s,"\r\n");
  __s[sVar3] = 0;
  if ((modeflags & 1U) != 0) {
    puts((char *)__s);
  }
  s = __s;
  do {
    bVar11 = *s;
    if (bVar11 < 0x20) {
      if (bVar11 != 9) goto LAB_00111f5a;
    }
    else if (bVar11 != 0x20) {
      if (bVar11 == 0x21) {
        psVar2->nwords = 2;
        ppcVar5 = (char **)safegrowarray(psVar2->words,&psVar2->wordssize,8,2,0,false);
        psVar2->words = ppcVar5;
        pcVar6 = dupstr("!");
        *psVar2->words = pcVar6;
        pcVar6 = dupstr((char *)(s + 1));
        psVar2->words[1] = pcVar6;
      }
      else if (bVar11 == 0x23) {
        psVar2->nwords = 0;
        psVar2->wordssize = 0;
      }
      else {
LAB_00111f5a:
        while( true ) {
          for (; (bVar11 = *s, bVar11 == 9 || (bVar11 == 0x20)); s = s + 1) {
          }
          if (bVar11 == 0) break;
          bVar11 = *s;
          bVar12 = bVar11 != 0;
          pbVar4 = s;
          pbVar9 = s;
          if (bVar12) {
            bVar10 = false;
            do {
              if ((!bVar10) && ((bVar11 == 9 || (bVar11 == 0x20)))) break;
              if (bVar11 == 0x22) {
                if (pbVar9[1] == 0x22) {
                  pbVar9 = pbVar9 + 2;
                  *pbVar4 = 0x22;
                  goto LAB_00111ef3;
                }
                pbVar9 = pbVar9 + 1;
                bVar10 = (bool)(bVar10 ^ 1);
              }
              else {
                pbVar9 = pbVar9 + 1;
                *pbVar4 = bVar11;
LAB_00111ef3:
                pbVar4 = pbVar4 + 1;
              }
              bVar11 = *pbVar9;
              bVar12 = bVar11 != 0;
            } while (bVar12);
          }
          *pbVar4 = 0;
          ppcVar5 = (char **)safegrowarray(psVar2->words,&psVar2->wordssize,8,psVar2->nwords,1,false
                                          );
          psVar2->words = ppcVar5;
          pcVar6 = dupstr((char *)s);
          sVar1 = psVar2->nwords;
          psVar2->nwords = sVar1 + 1;
          psVar2->words[sVar1] = pcVar6;
          s = pbVar9 + bVar12;
        }
      }
      safefree(__s);
      if (psVar2->nwords == 0) {
        pcVar8 = sftp_cmd_null;
      }
      else {
        psVar7 = lookup_command(*psVar2->words);
        if (psVar7 == (sftp_cmd_lookup *)0x0) {
          pcVar8 = sftp_cmd_unknown;
        }
        else {
          pcVar8 = psVar7->obey;
        }
      }
      psVar2->obey = pcVar8;
      return psVar2;
    }
    s = s + 1;
  } while( true );
}

Assistant:

struct sftp_command *sftp_getcmd(FILE *fp, int mode, int modeflags)
{
    char *line;
    struct sftp_command *cmd;
    char *p, *q, *r;
    bool quoting;

    cmd = snew(struct sftp_command);
    cmd->words = NULL;
    cmd->nwords = 0;
    cmd->wordssize = 0;

    line = NULL;

    if (fp) {
        if (modeflags & 1)
            printf("psftp> ");
        line = fgetline(fp);
    } else {
        line = ssh_sftp_get_cmdline("psftp> ", !backend);
    }

    if (!line || !*line) {
        cmd->obey = sftp_cmd_quit;
        if ((mode == 0) || (modeflags & 1))
            printf("quit\n");
        sfree(line);
        return cmd;                    /* eof */
    }

    line[strcspn(line, "\r\n")] = '\0';

    if (modeflags & 1) {
        printf("%s\n", line);
    }

    p = line;
    while (*p && (*p == ' ' || *p == '\t'))
        p++;

    if (*p == '!') {
        /*
         * Special case: the ! command. This is always parsed as
         * exactly two words: one containing the !, and the second
         * containing everything else on the line.
         */
        cmd->nwords = 2;
        sgrowarrayn(cmd->words, cmd->wordssize, cmd->nwords, 0);
        cmd->words[0] = dupstr("!");
        cmd->words[1] = dupstr(p+1);
    } else if (*p == '#') {
        /*
         * Special case: comment. Entire line is ignored.
         */
        cmd->nwords = cmd->wordssize = 0;
    } else {

        /*
         * Parse the command line into words. The syntax is:
         *  - double quotes are removed, but cause spaces within to be
         *    treated as non-separating.
         *  - a double-doublequote pair is a literal double quote, inside
         *    _or_ outside quotes. Like this:
         *
         *      firstword "second word" "this has ""quotes"" in" and""this""
         *
         * becomes
         *
         *      >firstword<
         *      >second word<
         *      >this has "quotes" in<
         *      >and"this"<
         */
        while (1) {
            /* skip whitespace */
            while (*p && (*p == ' ' || *p == '\t'))
                p++;
            /* terminate loop */
            if (!*p)
                break;
            /* mark start of word */
            q = r = p;                 /* q sits at start, r writes word */
            quoting = false;
            while (*p) {
                if (!quoting && (*p == ' ' || *p == '\t'))
                    break;                     /* reached end of word */
                else if (*p == '"' && p[1] == '"')
                    p += 2, *r++ = '"';    /* a literal quote */
                else if (*p == '"')
                    p++, quoting = !quoting;
                else
                    *r++ = *p++;
            }
            if (*p)
                p++;                   /* skip over the whitespace */
            *r = '\0';
            sgrowarray(cmd->words, cmd->wordssize, cmd->nwords);
            cmd->words[cmd->nwords++] = dupstr(q);
        }
    }

    sfree(line);

    /*
     * Now parse the first word and assign a function.
     */

    if (cmd->nwords == 0)
        cmd->obey = sftp_cmd_null;
    else {
        const struct sftp_cmd_lookup *lookup;
        lookup = lookup_command(cmd->words[0]);
        if (!lookup)
            cmd->obey = sftp_cmd_unknown;
        else
            cmd->obey = lookup->obey;
    }

    return cmd;
}